

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  size_t len;
  lua_State *L;
  
  if (i < (int)(uint)ms->level) {
    len = ms->capture[i].len;
    if (len == 0xfffffffffffffffe) {
      lua_pushinteger(ms->L,(lua_Integer)(ms->capture[i].init + (1 - (long)ms->src_init)));
      return;
    }
    if (len == 0xffffffffffffffff) {
      luaL_error(ms->L,"unfinished capture");
    }
    L = ms->L;
    s = ms->capture[i].init;
  }
  else {
    L = ms->L;
    if (i != 0) {
      luaL_error(L,"invalid capture index %%%d",(ulong)(i + 1));
      return;
    }
    len = (long)e - (long)s;
  }
  lua_pushlstring(L,s,len);
  return;
}

Assistant:

static void push_onecapture(MatchState *ms, int i, const char *s,
                            const char *e) {
    if (i >= ms->level) {
        if (i == 0)  /* ms->level == 0, too */
            lua_pushlstring(ms->L, s, e - s);  /* add whole match */
        else
            luaL_error(ms->L, "invalid capture index %%%d", i + 1);
    } else {
        ptrdiff_t l = ms->capture[i].len;
        if (l == CAP_UNFINISHED) luaL_error(ms->L, "unfinished capture");
        if (l == CAP_POSITION)
            lua_pushinteger(ms->L, (ms->capture[i].init - ms->src_init) + 1);
        else
            lua_pushlstring(ms->L, ms->capture[i].init, l);
    }
}